

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

int __thiscall QString::remove(QString *this,char *__filename)

{
  char *pcVar1;
  Data *pDVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  long lVar5;
  long in_RDX;
  char *pcVar6;
  long n;
  long in_FS_OFFSET;
  initializer_list<QtPrivate::QPodArrayOps<char16_t>::Span> ranges;
  QArrayDataPointer<char16_t> local_68;
  Span local_48;
  char16_t *local_38;
  char16_t *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (char *)(this->d).size;
  pcVar6 = __filename + ((long)__filename >> 0x3f & (ulong)pcVar1);
  lVar5 = (long)pcVar1 - (long)pcVar6;
  if (in_RDX >= 1 && (pcVar1 >= pcVar6 && lVar5 != 0)) {
    n = in_RDX;
    if (lVar5 < in_RDX) {
      n = lVar5;
    }
    pDVar2 = (this->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
      local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString((QString *)&local_68,(long)pcVar1 - n,
              (Initialization)
              CONCAT71((int7)((ulong)in_RDX >> 8),in_RDX < 1 || (pcVar1 < pcVar6 || lVar5 == 0)));
      local_48.begin = (this->d).ptr;
      local_48.end = local_48.begin + (long)pcVar6;
      local_38 = local_48.end + n;
      local_30 = local_48.begin + (this->d).size;
      ranges._M_len = 2;
      ranges._M_array = &local_48;
      QtPrivate::QPodArrayOps<char16_t>::copyRanges((QPodArrayOps<char16_t> *)&local_68,ranges);
      pDVar2 = (this->d).d;
      pcVar4 = (this->d).ptr;
      (this->d).d = local_68.d;
      (this->d).ptr = local_68.ptr;
      qVar3 = (this->d).size;
      (this->d).size = local_68.size;
      local_68.d = pDVar2;
      local_68.ptr = pcVar4;
      local_68.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
    else {
      QtPrivate::QPodArrayOps<char16_t>::erase
                ((QPodArrayOps<char16_t> *)this,(this->d).ptr + (long)pcVar6,n);
      (this->d).ptr[(this->d).size] = L'\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::remove(qsizetype pos, qsizetype len)
{
    if (pos < 0)  // count from end of string
        pos += size();

    if (size_t(pos) >= size_t(size()) || len <= 0)
        return *this;

    len = std::min(len, size() - pos);

    if (!d->isShared()) {
        d->erase(d.begin() + pos, len);
        d.data()[d.size] = u'\0';
    } else {
        // TODO: either reserve "size()", which is bigger than needed, or
        // modify the shrinking-erase docs of this method (since the size
        // of "copy" won't have any extra capacity any more)
        const qsizetype sz = size() - len;
        QString copy{sz, Qt::Uninitialized};
        auto begin = d.begin();
        auto toRemove_start = d.begin() + pos;
        copy.d->copyRanges({{begin, toRemove_start},
                           {toRemove_start + len, d.end()}});
        swap(copy);
    }
    return *this;
}